

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

void __thiscall
TEST_TestHarness_c_checkCheckText_Test::~TEST_TestHarness_c_checkCheckText_Test
          (TEST_TestHarness_c_checkCheckText_Test *this)

{
  TEST_TestHarness_c_checkCheckText_Test *this_local;
  
  ~TEST_TestHarness_c_checkCheckText_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestHarness_c, checkCheckText)
{
    CHECK_C_TEXT(true, "Text");
    fixture->setTestFunction(CheckTextMethod_);
    fixture->runAllTests();
    LONGS_EQUAL(1, fixture->getFailureCount());
    fixture->assertPrintContains("Message: CheckTestText");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}